

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O0

float LoopCBAircraftMaintenance
                (float inElapsedSinceLastCall,float param_2,int param_3,void *param_4)

{
  bool bVar1;
  logLevelTy lVar2;
  LTChannel *pLVar3;
  float in_XMM0_Da;
  DataRefs *in_stack_00000018;
  exception *e_2;
  RealTrafficConnection *pRTConn;
  exception *e_1;
  exception *e;
  DataRefs *in_stack_ffffffffffffff80;
  RealTrafficConnection *local_78;
  dataRefsLT in_stack_ffffffffffffff9c;
  
  do {
    LTRegularUpdates();
    if (in_XMM0_Da + LoopCBAircraftMaintenance::elapsedSinceLastAcMaint < 2.0) {
      LoopCBAircraftMaintenance::elapsedSinceLastAcMaint =
           in_XMM0_Da + LoopCBAircraftMaintenance::elapsedSinceLastAcMaint;
      return -5.0;
    }
    LoopCBAircraftMaintenance::elapsedSinceLastAcMaint = 0.0;
    bVar1 = DataRefs::IsReInitAll(&dataRefs);
    if (bVar1) {
      lVar2 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar2 < 3) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTMain.cpp"
               ,0x3cd,"LoopCBAircraftMaintenance",logWARN,"LiveTraffic is re-initializing itself");
      }
      CreateMsgWindow(8.0,logWARN);
      DataRefs::ForceDataReload(in_stack_ffffffffffffff80);
      DataRefs::SetReInitAll(&dataRefs,false);
      LogTimestamps();
    }
    DataRefs::WeatherFetchMETAR(in_stack_00000018);
    WeatherUpdate();
    bVar1 = LTAptRefresh();
    in_stack_ffffffffffffff9c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff9c);
    if (bVar1) {
      bVar1 = DataRefs::ShallKeepParkedAircraft((DataRefs *)0x202f31);
      in_stack_ffffffffffffff9c =
           CONCAT13((char)(in_stack_ffffffffffffff9c >> 0x18),
                    CONCAT12(bVar1,(short)in_stack_ffffffffffffff9c));
      if (bVar1) {
        pLVar3 = LTFlightDataGetCh(in_stack_ffffffffffffff9c);
        if (pLVar3 == (LTChannel *)0x0) {
          local_78 = (RealTrafficConnection *)0x0;
        }
        else {
          local_78 = (RealTrafficConnection *)
                     __dynamic_cast(pLVar3,&LTChannel::typeinfo,&RealTrafficConnection::typeinfo,0);
        }
        if (local_78 != (RealTrafficConnection *)0x0) {
          RealTrafficConnection::DoReadParkedTraffic(local_78);
        }
      }
    }
    LTFlightDataAcMaintenance();
    MenuUpdateAllItemStatus();
    PurgeMsgList();
    bVar1 = DataRefs::IsReInitAll(&dataRefs);
  } while (bVar1);
  return -5.0;
}

Assistant:

float LoopCBAircraftMaintenance (float inElapsedSinceLastCall, float, int, void*)
{
    static float elapsedSinceLastAcMaint = 0.0f;
    do {
        // *** check for new positons that require terrain altitude (Y Probes) ***
        // LiveTraffic Top Level Exception handling: catch all, reinit if something happens
        try {
            // regular calls collected here
            LTRegularUpdates();
            
            // all the rest we do only every 2s
            elapsedSinceLastAcMaint += inElapsedSinceLastCall;
            if (elapsedSinceLastAcMaint < AC_MAINT_INTVL)
                return FLIGHT_LOOP_INTVL;          // call me again
            
            // fall through to the expensive stuff
            elapsedSinceLastAcMaint = 0.0f;         // reset timing for a/c maintenance
            
        } catch (const std::exception& e) {
            // try re-init...
            LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, e.what());
            dataRefs.SetReInitAll(true);
        } catch (...) {
            // try re-init...
            dataRefs.SetReInitAll(true);
        }

        // *** Try recovery from something bad by re-initializing ourselves as much as possible ***
        // LiveTraffic Top Level Exception handling: catch all, die if something happens
        try {
            // asked for a generel re-initialization, e.g. due to time jumps?
            if (dataRefs.IsReInitAll()) {
                // force an initialization
                SHOW_MSG(logWARN, MSG_REINIT)
                dataRefs.ForceDataReload();
                // and reset the re-init flag
                dataRefs.SetReInitAll(false);
                // Log a new timestamp
                LogTimestamps();
            }
        } catch (const std::exception& e) {
            // Exception during re-init...we give up and disable ourselves
            LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, e.what());
            LOG_MSG(logFATAL, MSG_DISABLE_MYSELF);
            dataRefs.SetReInitAll(false);
            XPLMDisablePlugin(dataRefs.GetMyPluginId());
            return 0;           // don't call me again
        }
        
        // LiveTraffic Top Level Exception handling: catch all, reinit if something happens
        try {
            // Potentially refresh weather information
            dataRefs.WeatherFetchMETAR();
            // Update the weather (short-cuts if nothing to do)
            WeatherUpdate();
            
            // Refresh airport data from apt.dat (in case camera moved far)
            if (LTAptRefresh()) {                   // fresh airport data available?
                // If we are configured to keep parked aircraft, then we can ask RT to give us some
                if (dataRefs.ShallKeepParkedAircraft()) {
                    // Trigger RealTraffic to refresh parked aircraft
                    RealTrafficConnection* pRTConn =
                    dynamic_cast<RealTrafficConnection*>(LTFlightDataGetCh(DR_CHANNEL_REAL_TRAFFIC_ONLINE));
                    if (pRTConn)
                        pRTConn->DoReadParkedTraffic();
                }
            }
            // maintenance (add/remove)
            LTFlightDataAcMaintenance();
            // updates to menu item status
            MenuUpdateAllItemStatus();
            // Purge messages kept in local storage for display
            PurgeMsgList();
        } catch (const std::exception& e) {
            // try re-init...
            LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, e.what());
            dataRefs.SetReInitAll(true);
        } catch (...) {
            // try re-init...
            dataRefs.SetReInitAll(true);
        }
    }
    while (dataRefs.IsReInitAll());
    
    // keep calling me
    return FLIGHT_LOOP_INTVL;
}